

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O2

adjusted_mantissa
fast_float::digit_comp<float,char>(parsed_number_string_t<char> *num,adjusted_mantissa am)

{
  ulong uVar1;
  int iVar2;
  int32_t in_R8D;
  adjusted_mantissa aVar3;
  size_t digits;
  bigint bigmant;
  
  iVar2 = (int)num->exponent + 1;
  for (uVar1 = num->mantissa; 9999 < uVar1; uVar1 = uVar1 / 10000) {
    iVar2 = iVar2 + 4;
  }
  for (; 99 < uVar1; uVar1 = uVar1 / 100) {
    iVar2 = iVar2 + 2;
  }
  for (; 9 < uVar1; uVar1 = uVar1 / 10) {
    iVar2 = iVar2 + 1;
  }
  digits = 0;
  memset(&bigmant,0,0x1f8);
  parse_mantissa<char>(&bigmant,num,0x72,&digits);
  iVar2 = iVar2 - (int)digits;
  if (iVar2 < 0) {
    aVar3.mantissa = (ulong)(am.power2 + 0x8000);
    aVar3.power2 = iVar2;
    aVar3._12_4_ = 0;
    aVar3 = negative_digit_comp<float>((fast_float *)&bigmant,(bigint *)am.mantissa,aVar3,in_R8D);
  }
  else {
    aVar3 = positive_digit_comp<float>(&bigmant,iVar2);
  }
  return aVar3;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa digit_comp(parsed_number_string_t<UC>& num, adjusted_mantissa am) noexcept {
  // remove the invalid exponent bias
  am.power2 -= invalid_am_bias;

  int32_t sci_exp = scientific_exponent(num);
  size_t max_digits = binary_format<T>::max_digits();
  size_t digits = 0;
  bigint bigmant;
  parse_mantissa(bigmant, num, max_digits, digits);
  // can't underflow, since digits is at most max_digits.
  int32_t exponent = sci_exp + 1 - int32_t(digits);
  if (exponent >= 0) {
    return positive_digit_comp<T>(bigmant, exponent);
  } else {
    return negative_digit_comp<T>(bigmant, am, exponent);
  }
}